

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O2

pair<double,_double> __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::compute_minimum_maximum
          (Persistence_landscape_on_grid *this)

{
  double dVar1;
  pointer pvVar2;
  long lVar3;
  pointer *ppdVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  pair<double,_double> pVar10;
  
  pvVar2 = (this->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = ((long)(this->values_of_landscapes).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
  ppdVar4 = (pointer *)
            ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data + 8);
  dVar6 = 0.0;
  dVar7 = -1.79769313486232e+308;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    if (*ppdVar4 != ((_Vector_impl_data *)(ppdVar4 + -1))->_M_start) {
      dVar8 = *((_Vector_impl_data *)(ppdVar4 + -1))->_M_start;
      dVar9 = dVar8;
      if (dVar8 <= dVar7) {
        dVar9 = dVar7;
      }
      dVar1 = (*ppdVar4)[-1];
      dVar7 = dVar1;
      if (dVar1 <= dVar9) {
        dVar7 = dVar9;
      }
      if (dVar6 <= dVar8) {
        dVar8 = dVar6;
      }
      dVar6 = dVar1;
      if (dVar8 <= dVar1) {
        dVar6 = dVar8;
      }
    }
    ppdVar4 = ppdVar4 + 3;
  }
  pVar10.second = dVar7;
  pVar10.first = dVar6;
  return pVar10;
}

Assistant:

std::pair<double, double> compute_minimum_maximum() const {
    // since the function can only be entirely positive or negative, the maximal value will be an extremal value in the
    // arrays:
    double max_value = -std::numeric_limits<double>::max();
    double min_value = 0;
    for (size_t i = 0; i != this->values_of_landscapes.size(); ++i) {
      if (this->values_of_landscapes[i].size()) {
        if (this->values_of_landscapes[i][0] > max_value) max_value = this->values_of_landscapes[i][0];
        if (this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] > max_value)
          max_value = this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1];

        if (this->values_of_landscapes[i][0] < min_value) min_value = this->values_of_landscapes[i][0];
        if (this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] < min_value)
          min_value = this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1];
      }
    }
    return std::make_pair(min_value, max_value);
  }